

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conjunction_simplification.cpp
# Opt level: O3

void __thiscall
duckdb::ConjunctionSimplificationRule::ConjunctionSimplificationRule
          (ConjunctionSimplificationRule *this,ExpressionRewriter *rewriter)

{
  _Head_base<0UL,_duckdb::ExpressionMatcher_*,_false> _Var1;
  _Head_base<0UL,_duckdb::ConjunctionExpressionMatcher_*,_false> _Var2;
  pointer pCVar3;
  _Head_base<0UL,_duckdb::ConjunctionExpressionMatcher_*,_false> local_20;
  __uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>
  local_18;
  
  (this->super_Rule).rewriter = rewriter;
  (this->super_Rule).root.
  super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl = (ExpressionMatcher *)0x0
  ;
  (this->super_Rule)._vptr_Rule = (_func_int **)&PTR__Rule_0197a748;
  local_20._M_head_impl = (ConjunctionExpressionMatcher *)operator_new(0x40);
  ((local_20._M_head_impl)->super_ExpressionMatcher).expr_class = BOUND_CONJUNCTION;
  ((local_20._M_head_impl)->super_ExpressionMatcher).expr_type.
  super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       = (_Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
          )0x0;
  ((local_20._M_head_impl)->super_ExpressionMatcher).type.
  super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_> =
       (_Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>)0x0;
  ((local_20._M_head_impl)->super_ExpressionMatcher)._vptr_ExpressionMatcher =
       (_func_int **)&PTR__ConjunctionExpressionMatcher_0199b298;
  ((local_20._M_head_impl)->matchers).
  super_vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_20._M_head_impl)->matchers).
  super_vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_20._M_head_impl)->matchers).
  super_vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_20._M_head_impl)->policy = INVALID;
  pCVar3 = unique_ptr<duckdb::ConjunctionExpressionMatcher,_std::default_delete<duckdb::ConjunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::ConjunctionExpressionMatcher,_std::default_delete<duckdb::ConjunctionExpressionMatcher>,_true>
                         *)&local_20);
  local_18._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl =
       (tuple<duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>)
       operator_new(0x20);
  *(undefined1 *)
   ((long)local_18._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
          .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl + 8) = 0;
  *(long *)((long)local_18._M_t.
                  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
                  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl + 0x10) =
       0;
  *(long *)((long)local_18._M_t.
                  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
                  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl + 0x18) =
       0;
  *(undefined ***)
   local_18._M_t.
   super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
   .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl =
       &PTR__ExpressionMatcher_0199b358;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
              *)&pCVar3->matchers,
             (unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
              *)&local_18);
  if ((_Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
       )local_18._M_t.
        super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
        .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl !=
      (ExpressionMatcher *)0x0) {
    (**(code **)(*(long *)local_18._M_t.
                          super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
                          .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl +
                8))();
  }
  pCVar3 = unique_ptr<duckdb::ConjunctionExpressionMatcher,_std::default_delete<duckdb::ConjunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::ConjunctionExpressionMatcher,_std::default_delete<duckdb::ConjunctionExpressionMatcher>,_true>
                         *)&local_20);
  _Var2._M_head_impl = local_20._M_head_impl;
  pCVar3->policy = SOME;
  local_20._M_head_impl = (ConjunctionExpressionMatcher *)0x0;
  _Var1._M_head_impl =
       (this->super_Rule).root.
       super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
       .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl;
  (this->super_Rule).root.
  super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl =
       &(_Var2._M_head_impl)->super_ExpressionMatcher;
  if (_Var1._M_head_impl != (ExpressionMatcher *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_ExpressionMatcher + 8))();
    if (local_20._M_head_impl != (ConjunctionExpressionMatcher *)0x0) {
      (*((local_20._M_head_impl)->super_ExpressionMatcher)._vptr_ExpressionMatcher[1])();
    }
  }
  return;
}

Assistant:

ConjunctionSimplificationRule::ConjunctionSimplificationRule(ExpressionRewriter &rewriter) : Rule(rewriter) {
	// match on a ComparisonExpression that has a ConstantExpression as a check
	auto op = make_uniq<ConjunctionExpressionMatcher>();
	op->matchers.push_back(make_uniq<FoldableConstantMatcher>());
	op->policy = SetMatcher::Policy::SOME;
	root = std::move(op);
}